

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring64_bitmap_add_range_closed(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  int iVar1;
  ulong uVar2;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  art_t *in_RDI;
  roaring64_bitmap_t *unaff_retaddr;
  uint8_t current_high48 [6];
  uint64_t current;
  uint64_t max_high_bits;
  uint64_t min_high_bits;
  uint16_t max_low16;
  uint8_t max_high48 [6];
  uint16_t min_low16;
  uint8_t min_high48 [6];
  art_t *art;
  uint8_t *in_stack_ffffffffffffffa8;
  art_key_chunk_t *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  uint16_t max_00;
  uint16_t min_00;
  
  if (in_RSI <= in_RDX) {
    split_key((uint64_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    split_key((uint64_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar1 = compare_high48(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    max_00 = (uint16_t)((ulong)in_RDX >> 0x20);
    min_00 = (uint16_t)((ulong)in_RDX >> 0x30);
    if (iVar1 == 0) {
      add_range_closed_at(unaff_retaddr,in_RDI,in_RSI,min_00,max_00);
    }
    else {
      add_range_closed_at(unaff_retaddr,in_RDI,in_RSI,min_00,max_00);
      local_48 = (ulong)in_RSI >> 0x10;
      uVar2 = (ulong)in_RDX >> 0x10;
      while (local_48 = local_48 + 1, local_48 < uVar2) {
        split_key((uint64_t)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        add_range_closed_at(unaff_retaddr,in_RDI,in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),
                            (uint16_t)((ulong)in_RDX >> 0x20));
      }
      add_range_closed_at(unaff_retaddr,in_RDI,in_RSI,(uint16_t)((ulong)in_RDX >> 0x30),
                          (uint16_t)((ulong)in_RDX >> 0x20));
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_add_range_closed(roaring64_bitmap_t *r, uint64_t min,
                                       uint64_t max) {
    if (min > max) {
        return;
    }

    art_t *art = &r->art;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);
    if (compare_high48(min_high48, max_high48) == 0) {
        // Only populate range within one container.
        add_range_closed_at(r, art, min_high48, min_low16, max_low16);
        return;
    }

    // Populate a range across containers. Fill intermediate containers
    // entirely.
    add_range_closed_at(r, art, min_high48, min_low16, 0xffff);
    uint64_t min_high_bits = min >> 16;
    uint64_t max_high_bits = max >> 16;
    for (uint64_t current = min_high_bits + 1; current < max_high_bits;
         ++current) {
        uint8_t current_high48[ART_KEY_BYTES];
        split_key(current << 16, current_high48);
        add_range_closed_at(r, art, current_high48, 0, 0xffff);
    }
    add_range_closed_at(r, art, max_high48, 0, max_low16);
}